

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O0

int __thiscall iqnet::Socket::accept(Socket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int h;
  network_error *this_00;
  undefined4 in_register_00000034;
  Inet_addr local_80;
  undefined1 local_65;
  allocator<char> local_51;
  string local_50;
  int local_30;
  socklen_t local_2c;
  Handler new_sock;
  socklen_t len;
  sockaddr_in addr;
  Socket *this_local;
  
  addr.sin_zero._4_4_ = in_register_00000034;
  addr.sin_zero._0_4_ = __fd;
  local_2c = 0x10;
  h = ::accept(*(int *)((long)addr.sin_zero + 8),(sockaddr *)&new_sock,&local_2c);
  local_30 = h;
  if (h == -1) {
    local_65 = 1;
    this_00 = (network_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Socket::accept",&local_51);
    network_error::network_error(this_00,&local_50,true,0);
    local_65 = 0;
    __cxa_throw(this_00,&network_error::typeinfo,network_error::~network_error);
  }
  Inet_addr::Inet_addr(&local_80,(SystemSockAddrIn *)&new_sock);
  Socket(this,h,&local_80);
  Inet_addr::~Inet_addr(&local_80);
  return (int)this;
}

Assistant:

Socket Socket::accept()
{
  sockaddr_in addr;
  socklen_t len = sizeof(sockaddr_in);

  Handler new_sock = ::accept( sock, reinterpret_cast<sockaddr*>(&addr), &len );
  if( new_sock == -1 )
    throw network_error( "Socket::accept" );

  return Socket( new_sock, Inet_addr(addr) );
}